

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::cpp_function::strdup_guard::~strdup_guard(strdup_guard *this)

{
  bool bVar1;
  reference ppcVar2;
  char *s;
  iterator __end2;
  iterator __begin2;
  vector<char_*,_std::allocator<char_*>_> *__range2;
  strdup_guard *this_local;
  
  __end2 = std::vector<char_*,_std::allocator<char_*>_>::begin(&this->strings);
  s = (char *)std::vector<char_*,_std::allocator<char_*>_>::end(&this->strings);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                *)&s);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&__end2);
    free(*ppcVar2);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&__end2);
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->strings);
  return;
}

Assistant:

~strdup_guard() {
            for (auto s : strings)
                std::free(s);
        }